

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpj.cpp
# Opt level: O0

void __thiscall pg::FPJSolver::runSeqGreedy(FPJSolver *this)

{
  undefined1 auVar1 [16];
  undefined4 node;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint winner_00;
  uint uVar5;
  ulong uVar6;
  void *pvVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  ostream *poVar11;
  void *this_00;
  _label_vertex _Var12;
  int local_440;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [24];
  int winner;
  int v_2;
  int local_298;
  _label_vertex local_290;
  Game *local_280;
  int local_278;
  _label_vertex local_270;
  Game *local_260;
  int local_258;
  _label_vertex local_250;
  Game *local_240;
  int local_238;
  _label_vertex local_230;
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [24];
  int winner_to_1;
  int to_1;
  int *curedge_2;
  undefined1 local_1d0 [24];
  int winner_to;
  int to;
  int *curedge_1;
  int str;
  int onestep_winner;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  bitset local_168;
  _label_vertex local_148;
  undefined1 local_138 [28];
  int from;
  int *curedge;
  undefined1 local_110 [4];
  int v_1;
  byte local_fd;
  uint local_fc;
  undefined1 local_f8 [3];
  bool blockended;
  int i;
  uint local_e8;
  byte local_e1;
  int cur_parity;
  bool blockchanged;
  uintqueue Q;
  int local_bc;
  undefined1 local_b8 [4];
  int v;
  bitset parity;
  undefined1 local_88 [8];
  bitset distraction;
  bitset justified;
  int *strategy;
  FPJSolver *this_local;
  
  uVar6 = Solver::nodecount(&this->super_Solver);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar6;
  uVar6 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar6);
  sVar8 = Solver::nodecount(&this->super_Solver);
  bitset::bitset((bitset *)&distraction._allocsize,sVar8);
  sVar8 = Solver::nodecount(&this->super_Solver);
  bitset::bitset((bitset *)local_88,sVar8);
  sVar8 = Solver::nodecount(&this->super_Solver);
  bitset::bitset((bitset *)local_b8,sVar8);
  for (local_bc = 0; lVar9 = Solver::nodecount(&this->super_Solver), local_bc < lVar9;
      local_bc = local_bc + 1) {
    iVar4 = Solver::priority(&this->super_Solver,local_bc);
    bitset::operator[]((bitset *)&Q.pointer,(size_t)local_b8);
    bitset::reference::operator=((reference *)&Q.pointer,(bool)((byte)iVar4 & 1));
  }
  lVar9 = Solver::nodecount(&this->super_Solver);
  uintqueue::uintqueue((uintqueue *)&cur_parity,(uint)lVar9);
  local_e1 = 0;
  bitset::operator[]((bitset *)local_f8,(size_t)local_b8);
  bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_f8);
  local_e8 = (uint)bVar2;
  local_fc = 0;
  do {
    while( true ) {
      local_fd = 0;
      lVar9 = (long)(int)local_fc;
      lVar10 = Solver::nodecount(&this->super_Solver);
      if (lVar9 != lVar10) break;
      local_fd = 1;
LAB_00204b66:
      if ((local_fd & 1) != 0) {
        if ((local_e1 & 1) != 0) {
          while ((int)Q.queue != 0) {
            Q.queue._0_4_ = (int)Q.queue + -1;
            curedge._4_4_ = _cur_parity[(int)Q.queue];
            for (register0x00000000 = (uint *)Solver::ins(&this->super_Solver,curedge._4_4_);
                *stack0xfffffffffffffee0 != 0xffffffff;
                register0x00000000 = stack0xfffffffffffffee0 + 1) {
              local_138._20_4_ = *stack0xfffffffffffffee0;
              bitset::operator[]((bitset *)local_138,(size_t)&distraction._allocsize);
              bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_138);
              if ((bVar2) &&
                 ((*(int *)((long)pvVar7 + (long)(int)local_138._20_4_ * 4) == -1 ||
                  (*(uint *)((long)pvVar7 + (long)(int)local_138._20_4_ * 4) == curedge._4_4_)))) {
                if (1 < (this->super_Solver).trace) {
                  poVar11 = std::operator<<((this->super_Solver).logger,"\x1b[31;1mresetting\x1b[m "
                                           );
                  _Var12 = Solver::label_vertex(&this->super_Solver,local_138._20_4_);
                  local_168._bitssize = (size_t)_Var12.g;
                  local_168._allocsize._0_4_ = _Var12.v;
                  local_148.g = (Game *)local_168._bitssize;
                  local_148.v = (int)local_168._allocsize;
                  poVar11 = operator<<(poVar11,&local_148);
                  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                }
                bitset::operator[]((bitset *)(local_178 + 0x10),(size_t)&distraction._allocsize);
                bitset::reference::operator=((reference *)(local_178 + 0x10),false);
                bitset::operator[]((bitset *)local_178,(size_t)local_88);
                bitset::reference::operator=((reference *)local_178,false);
                iVar4 = (int)Q.queue + 1;
                _cur_parity[(int)Q.queue] = local_138._20_4_;
                Q.queue._0_4_ = iVar4;
                if ((int)local_138._20_4_ < (int)local_fc) {
                  local_fc = local_138._20_4_;
                }
              }
            }
          }
          if ((this->super_Solver).trace != 0) {
            poVar11 = std::operator<<((this->super_Solver).logger,
                                      "restarting after finding distractions of prio ");
            iVar4 = Solver::priority(&this->super_Solver,local_fc - 1);
            this_00 = (void *)std::ostream::operator<<(poVar11,iVar4);
            std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          }
          this->iterations = this->iterations + 1;
          local_e1 = 0;
        }
        lVar9 = (long)(int)local_fc;
        lVar10 = Solver::nodecount(&this->super_Solver);
        if (lVar9 == lVar10) {
          for (local_2b8._20_4_ = 0; lVar9 = (long)(int)local_2b8._20_4_,
              lVar10 = Solver::nodecount(&this->super_Solver), lVar9 < lVar10;
              local_2b8._20_4_ = local_2b8._20_4_ + 1) {
            bVar2 = bitset::operator[]((this->super_Solver).disabled,(long)(int)local_2b8._20_4_);
            if (!bVar2) {
              bitset::operator[]((bitset *)local_2b8,(size_t)local_b8);
              bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_2b8);
              bitset::operator[]((bitset *)local_2c8,(size_t)local_88);
              bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_2c8);
              node = local_2b8._20_4_;
              winner_00 = (uint)(bVar2 != bVar3);
              local_2b8._16_4_ = winner_00;
              uVar5 = Solver::owner(&this->super_Solver,local_2b8._20_4_);
              if (winner_00 == uVar5) {
                local_440 = *(int *)((long)pvVar7 + (long)(int)local_2b8._20_4_ * 4);
              }
              else {
                local_440 = -1;
              }
              Solver::solve(&this->super_Solver,node,winner_00,local_440);
            }
          }
          if (pvVar7 != (void *)0x0) {
            operator_delete__(pvVar7);
          }
          poVar11 = std::operator<<((this->super_Solver).logger,"solved with ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->iterations);
          poVar11 = std::operator<<(poVar11," iterations.");
          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          uintqueue::~uintqueue((uintqueue *)&cur_parity);
          bitset::~bitset((bitset *)local_b8);
          bitset::~bitset((bitset *)local_88);
          bitset::~bitset((bitset *)&distraction._allocsize);
          return;
        }
        bitset::operator[]((bitset *)local_188,(size_t)local_b8);
        bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_188);
        local_e8 = (uint)bVar2;
      }
      bitset::operator[]((bitset *)local_198,(size_t)&distraction._allocsize);
      bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_198);
      if (bVar2) {
        local_fc = local_fc + 1;
      }
      else {
        bitset::operator[]((bitset *)&str,(size_t)&distraction._allocsize);
        bitset::reference::operator=((reference *)&str,true);
        curedge_1._0_4_ = -1;
        iVar4 = Solver::owner(&this->super_Solver,local_fc);
        if (iVar4 == 0) {
          curedge_1._4_4_ = 1;
          for (_winner_to = Solver::outs(&this->super_Solver,local_fc); *_winner_to != -1;
              _winner_to = _winner_to + 1) {
            local_1d0._20_4_ = *_winner_to;
            bVar2 = bitset::operator[]((this->super_Solver).disabled,(long)(int)local_1d0._20_4_);
            if (!bVar2) {
              bitset::operator[]((bitset *)local_1d0,(size_t)local_b8);
              bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_1d0);
              bitset::operator[]((bitset *)&curedge_2,(size_t)local_88);
              bVar3 = bitset::reference::operator_cast_to_bool((reference *)&curedge_2);
              local_1d0._16_4_ = ZEXT14(bVar2 != bVar3);
              if (local_1d0._16_4_ == 0) {
                curedge_1._4_4_ = 0;
                curedge_1._0_4_ = local_1d0._20_4_;
                break;
              }
            }
          }
        }
        else {
          curedge_1._4_4_ = 0;
          for (_winner_to_1 = Solver::outs(&this->super_Solver,local_fc); *_winner_to_1 != -1;
              _winner_to_1 = _winner_to_1 + 1) {
            local_200._20_4_ = *_winner_to_1;
            bVar2 = bitset::operator[]((this->super_Solver).disabled,(long)(int)local_200._20_4_);
            if (!bVar2) {
              bitset::operator[]((bitset *)local_200,(size_t)local_b8);
              bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_200);
              bitset::operator[]((bitset *)local_210,(size_t)local_88);
              bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_210);
              local_200._16_4_ = ZEXT14(bVar2 != bVar3);
              if (local_200._16_4_ == 1) {
                curedge_1._4_4_ = 1;
                curedge_1._0_4_ = local_200._20_4_;
                break;
              }
            }
          }
        }
        *(int *)((long)pvVar7 + (long)(int)local_fc * 4) = (int)curedge_1;
        if (local_e8 == curedge_1._4_4_) {
          if (1 < (this->super_Solver).trace) {
            poVar11 = std::operator<<((this->super_Solver).logger,"\x1b[38;5;165;1mjustified\x1b[m "
                                     );
            _Var12 = Solver::label_vertex(&this->super_Solver,local_fc);
            local_280 = _Var12.g;
            local_278 = _Var12.v;
            local_270.g = local_280;
            local_270.v = local_278;
            operator<<(poVar11,&local_270);
            if (*(int *)((long)pvVar7 + (long)(int)local_fc * 4) != -1) {
              poVar11 = std::operator<<((this->super_Solver).logger," => ");
              _Var12 = Solver::label_vertex
                                 (&this->super_Solver,
                                  *(int *)((long)pvVar7 + (long)(int)local_fc * 4));
              _winner = _Var12.g;
              local_298 = _Var12.v;
              local_290.g = _winner;
              local_290.v = local_298;
              operator<<(poVar11,&local_290);
            }
            std::ostream::operator<<
                      ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
          }
        }
        else {
          _cur_parity[(int)Q.queue] = local_fc;
          Q.queue._0_4_ = (int)Q.queue + 1;
          bitset::operator[]((bitset *)local_220,(size_t)local_88);
          bitset::reference::operator=((reference *)local_220,true);
          local_e1 = 1;
          if (1 < (this->super_Solver).trace) {
            poVar11 = std::operator<<((this->super_Solver).logger,
                                      "\x1b[38;5;165;1mjustified*\x1b[m ");
            _Var12 = Solver::label_vertex(&this->super_Solver,local_fc);
            local_240 = _Var12.g;
            local_238 = _Var12.v;
            local_230.g = local_240;
            local_230.v = local_238;
            operator<<(poVar11,&local_230);
            if (*(int *)((long)pvVar7 + (long)(int)local_fc * 4) != -1) {
              poVar11 = std::operator<<((this->super_Solver).logger," => ");
              _Var12 = Solver::label_vertex
                                 (&this->super_Solver,
                                  *(int *)((long)pvVar7 + (long)(int)local_fc * 4));
              local_260 = _Var12.g;
              local_258 = _Var12.v;
              local_250.g = local_260;
              local_250.v = local_258;
              operator<<(poVar11,&local_250);
            }
            std::ostream::operator<<
                      ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
          }
        }
        local_fc = local_fc + 1;
      }
    }
    bVar2 = bitset::operator[]((this->super_Solver).disabled,(long)(int)local_fc);
    if (!bVar2) {
      bitset::operator[]((bitset *)local_110,(size_t)local_b8);
      bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_110);
      if (bVar2 != local_e8) {
        local_fd = 1;
      }
      goto LAB_00204b66;
    }
    local_fc = local_fc + 1;
  } while( true );
}

Assistant:

void
FPJSolver::runSeqGreedy()
{
    /**
     * Allocate and initialize data structures
     */

    int *strategy = new int[nodecount()]; // the current strategy
    bitset justified(nodecount()); // whether a vertex is justified
    bitset distraction(nodecount()); // whether a vertex is won by the opponent

    bitset parity(nodecount()); // optimization: precompute the parity of every vertex's priority
    for (int v=0; v<nodecount(); v++) parity[v] = priority(v)&1;

    uintqueue Q(nodecount());

    /**
     * Initialize loop
     */

    bool blockchanged = false; // did the current block change (new distractions)
    int cur_parity = parity[0]; // parity of current block
    int i = 0; // the current vertex

    for (;;) {
        /**
         * First detect if we are at the end of a block (vertices of same parity)
         */
        bool blockended = false;
        if (i == nodecount()) {
            blockended = true;
        } else {
            if (disabled[i]) { i++; continue; }
            if (parity[i] != cur_parity) blockended = true;
        }

        if (blockended) {
            if (blockchanged) {
                /**
                 * We have to reset all justified vertices that are now no longer justified...
                 */
                while (!Q.empty()) {
                    const int v = Q.pop();
                    for (auto curedge = ins(v); *curedge != -1; curedge++) {
                        const int from = *curedge;
                        if (justified[from]) {
                            if (strategy[from] == -1 or strategy[from] == v) {
#ifndef NDEBUG
                                if (trace >= 2) logger << "\033[31;1mresetting\033[m " << label_vertex(from) << std::endl;
#endif
                                justified[from] = false;
                                distraction[from] = false; // reset it
                                Q.push(from);
                                if (from < i) i = from; // afterwards, continue at lowest unjustified vertex
                            }
                        }
                    }
                }
#ifndef NDEBUG
                if (trace) logger << "restarting after finding distractions of prio " << priority(i-1) << std::endl;
#endif
                iterations++;
                blockchanged = false;
            }

            if (i == nodecount()) break; // in case the last block didn't result in unjustifications

            // continue with the new block, update the current parity
            cur_parity = parity[i];
        }

        // if the current vertex is justified, we don't need to check it
        if (justified[i]) { i++; continue; }
        justified[i] = true;

        // compute one step winner of <i> and update the strategy
        int onestep_winner, str = -1;
        if (owner(i) == 0) {
            // see if player Even can go to a vertex currently good for Even
            onestep_winner = 1;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 0) {
                    // good for player Even
                    onestep_winner = 0;
                    // and set the strategy
                    str = to;
                    break;
                }
            }
        } else {
            // see if player Odd can go to a vertex currently good for Odd
            onestep_winner = 0;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 1) {
                    // good for player Odd
                    onestep_winner = 1;
                    // and set the strategy
                    str = to;
                    break;
                }
            }
        }

        strategy[i] = str;

        // evaluation stays the same
        if (cur_parity != onestep_winner) {
            Q.push(i); // add to the Queue, because all justified predecessors are now invalid
            distraction[i] = true;
            blockchanged = true;
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "\033[38;5;165;1mjustified*\033[m " << label_vertex(i);
                if (strategy[i] != -1) logger << " => " << label_vertex(strategy[i]);
                logger << std::endl;
            }
#endif
        } else {
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "\033[38;5;165;1mjustified\033[m " << label_vertex(i);
                if (strategy[i] != -1) logger << " => " << label_vertex(strategy[i]);
                logger << std::endl;
            }
#endif
        }

        i++;
    }

    // done
    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        const int winner = parity[v] ^ distraction[v];
        Solver::solve(v, winner, winner == owner(v) ? strategy[v] : -1);
    }

    // free allocated data structures
    delete[] strategy;

    logger << "solved with " << iterations << " iterations." << std::endl;
}